

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O2

void __thiscall
StatisticsWriter::writeData
          (StatisticsWriter *this,ostream *stream,DataVector *data,string *delimiter)

{
  pointer pDVar1;
  
  pDVar1 = (data->super_vector<DataPoint,_std::allocator<DataPoint>_>).
           super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.super__Vector_impl_data
           ._M_start;
  while (pDVar1 != (data->super_vector<DataPoint,_std::allocator<DataPoint>_>).
                   super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
                   super__Vector_impl_data._M_finish) {
    if (pDVar1->active == false) {
      pDVar1 = pDVar1 + 1;
    }
    else {
      std::ostream::_M_insert<double>((ostream *)stream,pDVar1->value);
      pDVar1 = pDVar1 + 1;
      if (pDVar1 != (data->super_vector<DataPoint,_std::allocator<DataPoint>_>).
                    super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        std::operator<<((ostream *)stream,(string *)delimiter);
      }
    }
  }
  std::endl<char,std::char_traits<char>>((ostream *)stream);
  return;
}

Assistant:

void
    writeData(std::ostream & stream,
              DataVector const & data,
              std::string const delimiter = " ")
    {

        for (DataVector::const_iterator it = data.begin(); it != data.end();)
        {
            // Skip inactive data
            if (!it->active)
            {
                ++it;
                continue;
            }

            // Write out data
            stream << it->value;
            ++it;

            // Write out delimiter if not last entry
            if (it != data.end())
            {
                stream << delimiter;
            }
        }
        stream << std::endl;

    }